

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::clara::TextFlow::Column::iterator::isBoundary(iterator *this,size_t at)

{
  bool bVar1;
  long lVar2;
  string *psVar3;
  long in_RSI;
  bool local_11;
  char c;
  
  lVar2 = in_RSI;
  line_abi_cxx11_((iterator *)0x17ee16);
  c = (char)((ulong)lVar2 >> 0x38);
  lVar2 = ::std::__cxx11::string::size();
  local_11 = true;
  if (in_RSI != lVar2) {
    psVar3 = line_abi_cxx11_((iterator *)0x17ee3e);
    ::std::__cxx11::string::operator[]((ulong)psVar3);
    bVar1 = isWhitespace(c);
    if (bVar1) {
      psVar3 = line_abi_cxx11_((iterator *)0x17ee62);
      ::std::__cxx11::string::operator[]((ulong)psVar3);
      bVar1 = isWhitespace(c);
      if (!bVar1) {
        return true;
      }
    }
    psVar3 = line_abi_cxx11_((iterator *)0x17ee93);
    ::std::__cxx11::string::operator[]((ulong)psVar3);
    bVar1 = isBreakableBefore(c);
    local_11 = true;
    if (!bVar1) {
      psVar3 = line_abi_cxx11_((iterator *)0x17eebe);
      ::std::__cxx11::string::operator[]((ulong)psVar3);
      local_11 = isBreakableAfter(c);
    }
  }
  return local_11;
}

Assistant:

auto isBoundary(size_t at) const -> bool {
			assert(at > 0);
			assert(at <= line().size());

			return at == line().size() ||
				(isWhitespace(line()[at]) && !isWhitespace(line()[at - 1])) ||
				isBreakableBefore(line()[at]) ||
				isBreakableAfter(line()[at - 1]);
		}